

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

mapped_type __thiscall ChebTools::MonomialCoefficients::get_coeffs(MonomialCoefficients *this,int n)

{
  __buckets_ptr __ptr;
  size_type sVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  DenseStorage<double,__1,__1,_1,_0> *other;
  Index extraout_RDX;
  undefined4 in_register_00000034;
  _Hashtable<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  mapped_type mVar4;
  key_type local_2c;
  __buckets_ptr local_28;
  size_type local_20;
  
  this_00 = (_Hashtable<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)CONCAT44(in_register_00000034,n);
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,&local_2c);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    calc_coeffs((MonomialCoefficients *)&stack0xffffffffffffffd8,n);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_2c);
    __ptr = (__buckets_ptr)
            (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)local_28;
    sVar1 = (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
    (pmVar3->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         local_20;
    local_28 = __ptr;
    local_20 = sVar1;
    free(__ptr);
  }
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          std::__detail::
          _Map_base<int,_std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<int,_std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<const_int,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this_00,&local_2c);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,other);
  mVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  mVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (mapped_type)mVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto get_coeffs(int n){
            if (store.find(n) == store.end()){
                store[n] = calc_coeffs(n);
            }
            return store[n];
        }